

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

int uv_tcp_bind(uv_tcp_t *handle,sockaddr *addr,uint flags)

{
  int iVar1;
  uint uStack_8;
  
  if (handle->type != UV_TCP) {
    return -0x16;
  }
  if (addr->sa_family == 2) {
    uStack_8 = 0x10;
  }
  else {
    if (addr->sa_family != 10) {
      return -0x16;
    }
    uStack_8 = 0x1c;
  }
  iVar1 = uv__tcp_bind(handle,addr,uStack_8,flags);
  return iVar1;
}

Assistant:

int uv_tcp_bind(uv_tcp_t* handle,
                const struct sockaddr* addr,
                unsigned int flags) {
  unsigned int addrlen;

  if (handle->type != UV_TCP)
    return UV_EINVAL;

  if (addr->sa_family == AF_INET)
    addrlen = sizeof(struct sockaddr_in);
  else if (addr->sa_family == AF_INET6)
    addrlen = sizeof(struct sockaddr_in6);
  else
    return UV_EINVAL;

  return uv__tcp_bind(handle, addr, addrlen, flags);
}